

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.cpp
# Opt level: O1

string * read_file(string *__return_storage_ptr__,path *path)

{
  int iVar1;
  ContextManager *pCVar2;
  ssize_t sVar3;
  int iVar4;
  string local_60;
  path *local_40;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_38;
  
  local_40 = path;
  iVar1 = open(*(char **)path,0);
  if (iVar1 < 0) {
    pCVar2 = ContextManager::get();
    format_abi_cxx11_(&local_60,"Cannot open file \'%s\' for reading: %m",*(undefined8 *)local_40);
    (*(code *)**(undefined8 **)pCVar2)(pCVar2,&local_60);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60._M_dataplus._M_p != &local_60.field_2) {
      operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
    }
  }
  local_38 = &__return_storage_ptr__->field_2;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_38;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  do {
    sVar3 = read(iVar1,(anonymous_namespace)::read_buf,0x7ff);
    iVar4 = (int)sVar3;
    if (iVar4 < 0) {
      pCVar2 = ContextManager::get();
      format_abi_cxx11_(&local_60,"Cannot read from file \'%s\': %m",*(undefined8 *)local_40);
      (*(code *)**(undefined8 **)pCVar2)(pCVar2,&local_60);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_60._M_dataplus._M_p != &local_60.field_2) {
        operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
      }
    }
    if (iVar4 == 0) break;
    (anonymous_namespace)::read_buf[iVar4] = 0;
    std::__cxx11::string::append((char *)__return_storage_ptr__);
  } while (iVar4 != 0);
  iVar1 = close(iVar1);
  if (iVar1 != 0) {
    pCVar2 = ContextManager::get();
    format_abi_cxx11_(&local_60,"Cannot close file \'%s\': %m",*(undefined8 *)local_40);
    (*(code *)**(undefined8 **)pCVar2)(pCVar2,&local_60);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60._M_dataplus._M_p != &local_60.field_2) {
      operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string read_file(const fs::path &path) {
    fd_t fd = open(path.c_str(), O_RDONLY);
    if (fd < 0) {
        die(format("Cannot open file '%s' for reading: %m", path.c_str()));
    }

    std::string res;
    while (true) {
        int cnt = read(fd, read_buf, READ_BUF_SIZE - 1);
        if (cnt < 0) {
            die(format("Cannot read from file '%s': %m", path.c_str()));
        }
        if (cnt == 0) break;
        read_buf[cnt] = 0;
        res += read_buf;
    }

    if (close(fd) != 0) {
        die(format("Cannot close file '%s': %m", path.c_str()));
    }
    return res;
}